

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O1

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::nodeName
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,Schema target,Schema scope,
          Reader brand,Maybe<capnp::InterfaceSchema::Method> *method)

{
  _Rb_tree_header *p_Var1;
  Reader brand_00;
  undefined1 auVar2 [40];
  Reader brand_01;
  Reader brand_02;
  Reader type;
  Schema *pSVar3;
  RemoveConst<capnp::Schema> *pRVar4;
  Schema *pSVar5;
  undefined4 uVar6;
  StringTree *pSVar7;
  StringTree *pSVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Branch *pBVar11;
  char *pcVar12;
  size_t sVar13;
  short sVar14;
  mapped_type *pmVar15;
  WirePointer WVar16;
  ulong uVar17;
  _Base_ptr p_Var18;
  _Rb_tree_header *p_Var19;
  ArrayPtr<const_char> *params;
  _Base_ptr p_Var20;
  ArrayPtr<const_char> *params_00;
  WirePointer WVar21;
  SchemaLoader *this_00;
  WirePointer id;
  size_t sVar22;
  WirePointer id_00;
  WirePointer id_01;
  SegmentReader *pSVar23;
  SegmentReader *params_2;
  SegmentReader *pSVar24;
  code *in_R9;
  _Rb_tree_color _Var25;
  StringTree *pSVar26;
  ElementCount EVar27;
  WirePointer WVar28;
  Schema this_01;
  bool bVar29;
  ArrayPtr<const_char> AVar30;
  StringPtr delim;
  StringPtr delim_00;
  Reader scopeBrand;
  Vector<capnp::Schema> targetPath;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_capnpc_capnp_c__:110:5)>
  _kjContext110;
  Array<kj::StringTree> bindings;
  ArrayBuilder<kj::StringTree> parts;
  Reader proto_1;
  Reader nested;
  Schema part;
  map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
  scopeBindings;
  Schema parent_2;
  anon_class_8_1_a879b908 _kjContextFunc110;
  Reader proto;
  undefined1 local_368 [24];
  undefined8 uStack_350;
  Branch *local_348;
  SegmentReader *pSStack_340;
  undefined8 local_338;
  StringTree local_330;
  Vector<capnp::Schema> local_2f8;
  Vector<capnp::Schema> local_2d8;
  undefined1 local_2b8 [32];
  anon_union_40_1_a8c68091_for_NullableValue<kj::_::Debug::Context::Value>_2 local_298;
  ArrayPtr<const_char> **local_270;
  PointerReader local_268;
  StringTree *local_248;
  StringTree *pSStack_240;
  StringTree *local_238;
  byte *local_230;
  undefined1 local_228 [56];
  SegmentReader *local_1f0;
  WirePointer *local_1e8;
  WirePointer *local_1e0;
  uint local_1d8;
  ushort local_1d4;
  int local_1d0;
  Schema local_1c0;
  RawBrandedSchema *local_1b8;
  StringTree *local_1b0;
  Maybe<capnp::InterfaceSchema::Method> *local_1a8;
  Schema local_1a0;
  CapnpcCapnpMain *local_198;
  Schema local_190;
  StructReader local_188;
  SchemaLoader *local_150;
  anon_union_64_1_a8c68091_for_NullableValue<capnp::InterfaceSchema::Method>_2 *local_148;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
  local_140;
  Schema local_110;
  ArrayPtr<const_char> *local_108;
  Schema local_100;
  ListReader local_f8;
  Reader local_c8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_2f8.builder.endPtr = (Schema *)0x0;
  local_2f8.builder.ptr = (Schema *)0x0;
  local_2f8.builder.pos = (RemoveConst<capnp::Schema> *)0x0;
  local_2d8.builder.endPtr = (Schema *)0x0;
  local_2d8.builder.ptr = (Schema *)0x0;
  local_2d8.builder.pos = (Schema *)0x0;
  local_1b0 = __return_storage_ptr__;
  local_1a8 = method;
  local_1a0.raw = scope.raw;
  local_198 = this;
  kj::Vector<capnp::Schema>::setCapacity(&local_2f8,4);
  (local_2f8.builder.pos)->raw = target.raw;
  local_2f8.builder.pos = local_2f8.builder.pos + 1;
  local_140._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_140._M_impl.super__Rb_tree_header._M_header;
  local_140._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_140._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (brand._reader.pointerCount == 0) {
    brand._reader.nestingLimit = 0x7fffffff;
    brand._reader.pointers = (WirePointer *)0x0;
    brand._reader.segment = (SegmentReader *)0x0;
    brand._reader.capTable = (CapTableReader *)(StringTree *)0x0;
  }
  local_330.size_ = (size_t)brand._reader.segment;
  local_330.text.content.ptr = (char *)brand._reader.capTable;
  local_330.text.content.size_ = (size_t)brand._reader.pointers;
  local_330.text.content.disposer._0_4_ = brand._reader.nestingLimit;
  local_140._M_impl.super__Rb_tree_header._M_header._M_right =
       local_140._M_impl.super__Rb_tree_header._M_header._M_left;
  _::PointerReader::getList
            ((ListReader *)local_2b8,(PointerReader *)&local_330,INLINE_COMPOSITE,(word *)0x0);
  uVar6 = local_2b8._24_4_;
  pSVar26 = (StringTree *)(local_2b8._24_8_ & 0xffffffff);
  local_1b8 = target.raw;
  if (local_2b8._24_4_ != 0) {
    EVar27 = 0;
    do {
      _::ListReader::getStructElement((StructReader *)&local_330,(ListReader *)local_2b8,EVar27);
      if (((uint)local_330.branches.ptr < 0x50) ||
         ((short)((SegmentId *)(local_330.text.content.size_ + 8))->value == 0)) {
        if (local_330.branches.ptr._4_2_ == 0) {
          local_228._24_4_ = 0x7fffffff;
          local_228._8_8_ = (StringTree *)0x0;
          local_228._16_8_ = (WirePointer *)0x0;
          local_228._0_8_ = (SegmentReader *)0x0;
        }
        else {
          local_228._16_8_ =
               CONCAT44(local_330.text.content.disposer._4_4_,(int)local_330.text.content.disposer);
          local_228._8_8_ = local_330.text.content.ptr;
          local_228._0_8_ = local_330.size_;
          local_228._24_4_ = (int)local_330.branches.size_;
        }
        _::PointerReader::getList
                  ((ListReader *)local_368,(PointerReader *)local_228,INLINE_COMPOSITE,(word *)0x0);
        if ((uint)local_330.branches.ptr < 0x40) {
          local_228._0_8_ = (char *)0x0;
        }
        else {
          local_228._0_8_ = *(undefined8 *)(WireValue<uint32_t> *)local_330.text.content.size_;
        }
        pmVar15 = std::
                  map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
                  ::operator[]((map<unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
                                *)&local_140,(key_type *)local_228);
        *(Branch **)&(pmVar15->reader).structDataSize = local_348;
        *(SegmentReader **)&(pmVar15->reader).nestingLimit = pSStack_340;
        *(undefined4 *)&(pmVar15->reader).ptr = local_368._16_4_;
        *(undefined4 *)((long)&(pmVar15->reader).ptr + 4) = local_368._20_4_;
        (pmVar15->reader).elementCount = (ListElementCount)uStack_350;
        (pmVar15->reader).step = uStack_350._4_4_;
        (pmVar15->reader).segment = (SegmentReader *)local_368._0_8_;
        (pmVar15->reader).capTable = (CapTableReader *)local_368._8_8_;
      }
      EVar27 = EVar27 + 1;
    } while (uVar6 != EVar27);
  }
  local_330.size_ = (size_t)local_1b8;
  this_00 = &local_198->schemaLoader;
  local_1c0.raw = (RawBrandedSchema *)(_::NULL_SCHEMA + 0x48);
  while( true ) {
    Schema::getProto((Reader *)local_2b8,(Schema *)&local_330);
    if (((uint)local_298._0_4_ < 0xc0) ||
       (*(WirePointer *)(local_2b8._16_8_ + 0x10) == (WirePointer)0x0)) break;
    Schema::getProto((Reader *)local_2b8,(Schema *)&local_330);
    if ((uint)local_298._0_4_ < 0xc0) {
      id.offsetAndKind.value = 0;
      id.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      id = *(WirePointer *)(local_2b8._16_8_ + 0x10);
    }
    local_48 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    uStack_40 = 0x7fffffff;
    auVar2 = ZEXT1640(ZEXT816(0));
    brand_00._reader._40_8_ = 0x7fffffff;
    brand_00._reader.segment = (SegmentReader *)auVar2._0_8_;
    brand_00._reader.capTable = (CapTableReader *)auVar2._8_8_;
    brand_00._reader.data = (void *)auVar2._16_8_;
    brand_00._reader.pointers = (WirePointer *)auVar2._24_8_;
    brand_00._reader.dataSize = auVar2._32_4_;
    brand_00._reader.pointerCount = auVar2._36_2_;
    brand_00._reader._38_2_ = auVar2._38_2_;
    local_330.size_ = (size_t)SchemaLoader::get(this_00,(uint64_t)id,brand_00,local_1c0);
    if (local_2f8.builder.pos == local_2f8.builder.endPtr) {
      sVar22 = (long)local_2f8.builder.endPtr - (long)local_2f8.builder.ptr >> 2;
      if (local_2f8.builder.endPtr == local_2f8.builder.ptr) {
        sVar22 = 4;
      }
      kj::Vector<capnp::Schema>::setCapacity(&local_2f8,sVar22);
    }
    (local_2f8.builder.pos)->raw = (RawBrandedSchema *)local_330.size_;
    local_2f8.builder.pos = local_2f8.builder.pos + 1;
  }
  local_330.size_ = (size_t)local_1a0.raw;
  if (local_2d8.builder.pos == local_2d8.builder.endPtr) {
    sVar22 = 4;
    if (local_2d8.builder.endPtr != local_2d8.builder.ptr) {
      sVar22 = (long)local_2d8.builder.endPtr - (long)local_2d8.builder.ptr >> 2;
    }
    kj::Vector<capnp::Schema>::setCapacity(&local_2d8,sVar22);
  }
  (local_2d8.builder.pos)->raw = (RawBrandedSchema *)local_330.size_;
  while( true ) {
    local_2d8.builder.pos = local_2d8.builder.pos + 1;
    Schema::getProto((Reader *)local_2b8,(Schema *)&local_330);
    if (((uint)local_298._0_4_ < 0xc0) ||
       (*(WirePointer *)(local_2b8._16_8_ + 0x10) == (WirePointer)0x0)) break;
    Schema::getProto((Reader *)local_2b8,(Schema *)&local_330);
    if ((uint)local_298._0_4_ < 0xc0) {
      id_00.offsetAndKind.value = 0;
      id_00.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      id_00 = *(WirePointer *)(local_2b8._16_8_ + 0x10);
    }
    local_78 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    uStack_70 = 0x7fffffff;
    auVar2 = ZEXT1640(ZEXT816(0));
    brand_01._reader._40_8_ = 0x7fffffff;
    brand_01._reader.segment = (SegmentReader *)auVar2._0_8_;
    brand_01._reader.capTable = (CapTableReader *)auVar2._8_8_;
    brand_01._reader.data = (void *)auVar2._16_8_;
    brand_01._reader.pointers = (WirePointer *)auVar2._24_8_;
    brand_01._reader.dataSize = auVar2._32_4_;
    brand_01._reader.pointerCount = auVar2._36_2_;
    brand_01._reader._38_2_ = auVar2._38_2_;
    local_330.size_ = (size_t)SchemaLoader::get(this_00,(uint64_t)id_00,brand_01,local_1c0);
    if (local_2d8.builder.pos == local_2d8.builder.endPtr) {
      sVar22 = (long)local_2d8.builder.endPtr - (long)local_2d8.builder.ptr >> 2;
      if (local_2d8.builder.endPtr == local_2d8.builder.ptr) {
        sVar22 = 4;
      }
      kj::Vector<capnp::Schema>::setCapacity(&local_2d8,sVar22);
    }
    (local_2d8.builder.pos)->raw = (RawBrandedSchema *)local_330.size_;
  }
  if (local_2d8.builder.pos != local_2d8.builder.ptr) {
    do {
      if (((ulong)((long)local_2f8.builder.pos - (long)local_2f8.builder.ptr) < 9) ||
         (local_2d8.builder.pos[-1].raw != local_2f8.builder.pos[-1].raw)) break;
      Schema::getProto((Reader *)local_2b8,local_2d8.builder.pos + -1);
      p_Var18 = &local_140._M_impl.super__Rb_tree_header._M_header;
      p_Var20 = local_140._M_impl.super__Rb_tree_header._M_header._M_parent;
      if ((uint)local_298._0_4_ < 0x40) {
        WVar16.offsetAndKind.value = 0;
        WVar16.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      }
      else {
        WVar16 = *(WirePointer *)local_2b8._16_8_;
      }
      for (; (_Rb_tree_header *)p_Var20 != (_Rb_tree_header *)0x0;
          p_Var20 = (&p_Var20->_M_left)[(ulong)*(WirePointer *)(p_Var20 + 1) < (ulong)WVar16]) {
        if ((ulong)*(WirePointer *)(p_Var20 + 1) >= (ulong)WVar16) {
          p_Var18 = p_Var20;
        }
      }
      p_Var1 = &local_140._M_impl.super__Rb_tree_header;
      p_Var19 = p_Var1;
      if (((_Rb_tree_header *)p_Var18 != p_Var1) &&
         (p_Var19 = (_Rb_tree_header *)p_Var18,
         (ulong)WVar16 < ((_Rb_tree_header *)p_Var18)->_M_node_count)) {
        p_Var19 = p_Var1;
      }
      if (p_Var19 != p_Var1) break;
      local_2f8.builder.pos = local_2f8.builder.pos + -1;
      local_2d8.builder.pos = local_2d8.builder.pos + -1;
    } while (local_2d8.builder.pos != local_2d8.builder.ptr);
  }
  sVar22 = (long)local_2f8.builder.pos - (long)local_2f8.builder.ptr >> 3;
  params_2 = (SegmentReader *)0x0;
  local_248 = (StringTree *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x38,0,sVar22,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_238 = local_248 + sVar22;
  local_230 = (byte *)&kj::_::HeapArrayDisposer::instance;
  pSStack_240 = local_248;
  if (local_2f8.builder.pos != local_2f8.builder.ptr) {
    local_148 = &(local_1a8->ptr).field_1;
    uVar9 = local_368._8_8_;
    uVar10 = local_368._16_8_;
    pBVar11 = local_348;
    pSVar23 = pSStack_340;
    local_150 = this_00;
    do {
      pSStack_340 = pSVar23;
      local_348 = pBVar11;
      local_368._16_8_ = uVar10;
      local_368._8_8_ = uVar9;
      this_01.raw = (RawBrandedSchema *)&local_330;
      AVar30.size_ = (size_t)this_01.raw;
      AVar30.ptr = (char *)pSVar26;
      local_190.raw = local_2f8.builder.pos[-1].raw;
      Schema::getProto(&local_c8,&local_190);
      local_348 = (Branch *)0x0;
      pSStack_340 = (SegmentReader *)0x0;
      local_368._16_8_ = (SegmentReader *)0x0;
      uStack_350 = (SegmentReader *)0x0;
      local_368._0_8_ = (SegmentReader *)0x0;
      local_368._8_8_ = (CapTableReader *)0x0;
      local_338 = (ArrayDisposer *)0x0;
      if ((local_c8._reader.dataSize < 0xc0) ||
         (*(ulong *)((long)local_c8._reader.data + 0x10) == 0)) {
        local_330.text.content.ptr = (char *)local_c8._reader.capTable;
        local_330.text.content.size_ = (size_t)local_c8._reader.pointers;
        local_330.size_ = (size_t)local_c8._reader.segment;
        local_330.text.content.disposer._0_4_ = local_c8._reader.nestingLimit;
        if (local_c8._reader.pointerCount == 0) {
          local_330.text.content.ptr = (char *)(StringTree *)0x0;
          local_330.text.content.size_ = (size_t)(SegmentReader *)0x0;
          local_330.size_ = (size_t)(SegmentReader *)0x0;
          local_330.text.content.disposer._0_4_ = 0x7fffffff;
        }
        local_228._0_16_ =
             (undefined1  [16])
             _::PointerReader::getBlob<capnp::Text>((PointerReader *)this_01.raw,(void *)0x0,0);
        local_330.size_ = CONCAT71(local_330.size_._1_7_,0x22);
        kj::strTree<char_const(&)[10],capnp::Text::Reader,char>
                  ((StringTree *)local_2b8,(kj *)"import \"/",(char (*) [10])local_228,
                   (Reader *)this_01.raw,(char *)params_2);
        pSVar23 = (SegmentReader *)local_368._16_8_;
        uVar9 = local_368._8_8_;
        local_368._0_8_ = local_2b8._0_8_;
        if ((CapTableReader *)local_368._8_8_ != (CapTableReader *)0x0) {
          local_368._8_8_ = (CapTableReader *)0x0;
          local_368._16_8_ = (byte *)0x0;
          in_R9 = (code *)0x0;
          (*(code *)*uStack_350->arena)(uStack_350,uVar9,1);
          params_2 = pSVar23;
        }
        pSVar23 = pSStack_340;
        pBVar11 = local_348;
        local_368._8_8_ = local_2b8._8_8_;
        local_368._16_8_ = local_2b8._16_8_;
        uStack_350 = (SegmentReader *)local_2b8._24_8_;
        local_2b8._8_8_ = (Schema)0x0;
        local_2b8._16_8_ = (SegmentReader *)0x0;
        if (local_348 != (Branch *)0x0) {
          local_348 = (Branch *)0x0;
          pSStack_340 = (SegmentReader *)0x0;
          in_R9 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
          (*(code *)**(undefined8 **)local_338)(local_338,pBVar11,0x40);
          params_2 = pSVar23;
        }
        pSVar23 = (SegmentReader *)local_2b8._16_8_;
        uVar9 = local_2b8._8_8_;
        local_348 = (Branch *)local_298.value.file;
        pSStack_340 = (SegmentReader *)local_298._8_8_;
        local_338 = (ArrayDisposer *)local_298.value.description.content.ptr;
        local_298.value.file = (char *)0x0;
        local_298._8_8_ = (WirePointer *)0x0;
        if ((RawBrandedSchema *)local_2b8._8_8_ != (RawBrandedSchema *)0x0) {
          local_2b8._8_8_ = (Schema)0x0;
          local_2b8._16_8_ = (SegmentReader *)0x0;
          in_R9 = (code *)0x0;
          (*(code *)**(undefined8 **)(WireValue<uint32_t> *)local_2b8._24_8_)
                    (local_2b8._24_8_,uVar9,1);
          params_2 = pSVar23;
        }
      }
      else {
        local_100.raw = local_190.raw;
        Schema::getProto((Reader *)local_228,&local_100);
        local_108 = (ArrayPtr<const_char> *)local_228;
        kj::_::Debug::Context::Context((Context *)local_2b8);
        local_2b8._0_8_ = &PTR__Context_001c83a0;
        local_270 = &local_108;
        if ((uint)local_228._32_4_ < 0xc0) {
          id_01.offsetAndKind.value = 0;
          id_01.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        }
        else {
          id_01 = *(WirePointer *)(local_228._16_8_ + 0x10);
        }
        local_188.dataSize = 0;
        local_188.pointerCount = 0;
        local_188._38_2_ = 0;
        local_188.data = (short *)0x0;
        local_188.pointers = (WirePointer *)0x0;
        local_188.segment = (SegmentReader *)0x0;
        local_188.capTable = (CapTableReader *)0x0;
        local_188.nestingLimit = 0x7fffffff;
        local_188._44_4_ = 0;
        auVar2 = ZEXT1640(ZEXT816(0));
        brand_02._reader._40_8_ = 0x7fffffff;
        brand_02._reader.segment = (SegmentReader *)auVar2._0_8_;
        brand_02._reader.capTable = (CapTableReader *)auVar2._8_8_;
        brand_02._reader.data = (void *)auVar2._16_8_;
        brand_02._reader.pointers = (WirePointer *)auVar2._24_8_;
        brand_02._reader.dataSize = auVar2._32_4_;
        brand_02._reader.pointerCount = auVar2._36_2_;
        brand_02._reader._38_2_ = auVar2._38_2_;
        local_110 = SchemaLoader::get(this_00,(uint64_t)id_01,brand_02,local_1c0);
        Schema::getProto((Reader *)(local_228 + 0x30),&local_110);
        if (local_1d4 < 2) {
          local_268.nestingLimit = 0x7fffffff;
          local_268.capTable = (CapTableReader *)0x0;
          local_268.pointer = (WirePointer *)0x0;
          local_268.segment = (SegmentReader *)0x0;
        }
        else {
          local_268.pointer = local_1e0 + 1;
          local_268.capTable = (CapTableReader *)local_1f0;
          local_268.segment = (SegmentReader *)local_228._48_8_;
          local_268.nestingLimit = local_1d0;
        }
        _::PointerReader::getList(&local_f8,&local_268,INLINE_COMPOSITE,(word *)0x0);
        local_1b8 = (RawBrandedSchema *)CONCAT44(local_1b8._4_4_,local_f8.elementCount);
        bVar29 = local_f8.elementCount == 0;
        if (!bVar29) {
          bVar29 = false;
          EVar27 = 0;
          do {
            _::ListReader::getStructElement((StructReader *)(local_228 + 0x30),&local_f8,EVar27);
            if (local_1d8 < 0x40) {
              WVar28.offsetAndKind.value = 0;
              WVar28.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            }
            else {
              WVar28 = *(WirePointer *)&local_1e8->offsetAndKind;
            }
            if ((uint)local_228._32_4_ < 0x40) {
              WVar21.offsetAndKind.value = 0;
              WVar21.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
            }
            else {
              WVar21 = *(WirePointer *)local_228._16_8_;
            }
            if (WVar28 == WVar21) {
              local_268.capTable = (CapTableReader *)local_1f0;
              local_268.pointer = local_1e0;
              local_268.segment = (SegmentReader *)local_228._48_8_;
              local_268.nestingLimit = local_1d0;
              if (local_1d4 == 0) {
                local_268.capTable = (CapTableReader *)(SegmentReader *)0x0;
                local_268.pointer = (WirePointer *)0x0;
                local_268.segment = (SegmentReader *)0x0;
                local_268.nestingLimit = 0x7fffffff;
              }
              AVar30 = (ArrayPtr<const_char>)
                       _::PointerReader::getBlob<capnp::Text>(&local_268,(void *)0x0,0);
            }
            pSVar26 = (StringTree *)AVar30.ptr;
            if (WVar28 == WVar21) break;
            EVar27 = EVar27 + 1;
            bVar29 = (ElementCount)local_1b8 == EVar27;
          } while (!bVar29);
          this_01.raw = (RawBrandedSchema *)(AVar30.size_ - 1);
        }
        if (bVar29) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[73]>
                    ((Fault *)&local_f8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/capnpc-capnp.c++"
                     ,0x75,FAILED,(char *)0x0,
                     "\"A schema Node\'s supposed scope did not contain the node as a NestedNode.\""
                     ,(char (*) [73])
                      "A schema Node\'s supposed scope did not contain the node as a NestedNode.");
          kj::_::Debug::Fault::fatal((Fault *)&local_f8);
        }
        kj::_::Debug::Context::~Context((Context *)local_2b8);
        this_00 = local_150;
        local_2b8._0_8_ = pSVar26;
        local_2b8._8_8_ = this_01.raw;
        kj::StringTree::concat<kj::ArrayPtr<char_const>>(&local_330,(StringTree *)local_2b8,params);
        pSVar23 = (SegmentReader *)local_368._16_8_;
        uVar9 = local_368._8_8_;
        local_368._0_8_ = local_330.size_;
        if ((CapTableReader *)local_368._8_8_ != (CapTableReader *)0x0) {
          local_368._8_8_ = (CapTableReader *)0x0;
          local_368._16_8_ = (byte *)0x0;
          in_R9 = (code *)0x0;
          (*(code *)*uStack_350->arena)(uStack_350,uVar9,1);
          params_2 = pSVar23;
        }
        pSVar23 = pSStack_340;
        pBVar11 = local_348;
        local_368._8_8_ = local_330.text.content.ptr;
        local_368._16_8_ = local_330.text.content.size_;
        uStack_350 = (SegmentReader *)
                     CONCAT44(local_330.text.content.disposer._4_4_,
                              (int)local_330.text.content.disposer);
        local_330.text.content.ptr = (char *)0x0;
        local_330.text.content.size_ = 0;
        if (local_348 != (Branch *)0x0) {
          local_348 = (Branch *)0x0;
          pSStack_340 = (SegmentReader *)0x0;
          in_R9 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
          (*(code *)**(undefined8 **)local_338)(local_338,pBVar11,0x40);
          params_2 = pSVar23;
        }
        pSVar23 = (SegmentReader *)local_330.text.content.size_;
        pcVar12 = local_330.text.content.ptr;
        local_348 = local_330.branches.ptr;
        pSStack_340 = (SegmentReader *)local_330.branches.size_;
        local_338 = (ArrayDisposer *)
                    CONCAT44(local_330.branches.disposer._4_4_,local_330.branches.disposer._0_4_);
        local_330.branches.ptr = (Branch *)0x0;
        local_330.branches.size_ = 0;
        if ((StringTree *)local_330.text.content.ptr != (StringTree *)0x0) {
          local_330.text.content.ptr = (char *)0x0;
          local_330.text.content.size_ = 0;
          in_R9 = (code *)0x0;
          (*(code *)**(undefined8 **)
                      CONCAT44(local_330.text.content.disposer._4_4_,
                               (int)local_330.text.content.disposer))
                    ((undefined8 *)
                     CONCAT44(local_330.text.content.disposer._4_4_,
                              (int)local_330.text.content.disposer),pcVar12,1);
          params_2 = pSVar23;
        }
      }
      p_Var18 = &local_140._M_impl.super__Rb_tree_header._M_header;
      p_Var20 = local_140._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (local_c8._reader.dataSize < 0x40) {
        uVar17 = 0;
      }
      else {
        uVar17 = *local_c8._reader.data;
      }
      for (; p_Var20 != (_Base_ptr)0x0;
          p_Var20 = (&p_Var20->_M_left)[*(ulong *)(p_Var20 + 1) < uVar17]) {
        if (*(ulong *)(p_Var20 + 1) >= uVar17) {
          p_Var18 = p_Var20;
        }
      }
      p_Var1 = &local_140._M_impl.super__Rb_tree_header;
      p_Var20 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var18 != p_Var1) &&
         (p_Var20 = p_Var18, uVar17 < *(ulong *)(p_Var18 + 1))) {
        p_Var20 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var20 != p_Var1) {
        _Var25 = p_Var20[2]._M_color;
        local_228._48_8_ =
             kj::_::HeapArrayDisposer::allocateImpl
                       (0x38,0,(ulong)_Var25,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
        local_1e8 = (WirePointer *)(local_228._48_8_ + (ulong)_Var25 * 0x38);
        local_1e0 = (WirePointer *)&kj::_::HeapArrayDisposer::instance;
        local_1f0 = (SegmentReader *)local_228._48_8_;
        if (p_Var20[2]._M_color != _S_red) {
          pSVar26 = (StringTree *)0x0;
          pcVar12 = local_330.text.content.ptr;
          sVar22 = local_330.text.content.size_;
          pBVar11 = local_330.branches.ptr;
          sVar13 = local_330.branches.size_;
          do {
            local_330.branches.size_ = sVar13;
            local_330.branches.ptr = pBVar11;
            local_330.text.content.size_ = sVar22;
            local_330.text.content.ptr = pcVar12;
            _::ListReader::getStructElement
                      (&local_188,(ListReader *)&p_Var20[1]._M_parent,(ElementCount)pSVar26);
            if (local_188.dataSize < 0x10) {
              sVar14 = 0;
            }
            else {
              sVar14 = *local_188.data;
            }
            if (sVar14 == 1) {
              if (local_188.pointerCount == 0) {
                local_f8.elementCount = 0x7fffffff;
                local_f8.capTable = (CapTableReader *)0x0;
                local_f8.ptr = (byte *)0x0;
                local_f8.segment = (SegmentReader *)0x0;
              }
              else {
                local_f8.capTable = local_188.capTable;
                local_f8.ptr = (byte *)local_188.pointers;
                local_f8.segment = local_188.segment;
                local_f8.elementCount = local_188.nestingLimit;
              }
              _::PointerReader::getStruct
                        ((StructReader *)local_228,(PointerReader *)&local_f8,(word *)0x0);
              bVar29 = (local_1a8->ptr).isSet;
              local_2b8[0] = bVar29;
              if (bVar29 == true) {
                local_2b8._8_8_ = (local_148->value).parent.super_Schema.raw;
                local_2b8._16_8_ = *(undefined8 *)((long)local_148 + 8);
                local_2b8._24_8_ = *(ulong *)((long)local_148 + 0x10);
                local_298.value.file = (char *)*(long *)((long)local_148 + 0x18);
                local_298._8_8_ = *(undefined8 *)((long)local_148 + 0x20);
                local_298.value.description.content.ptr =
                     (char *)*(undefined8 *)((long)local_148 + 0x28);
                local_298.value.description.content.size_ = *(size_t *)((long)local_148 + 0x30);
                local_298.value.description.content.disposer =
                     (ArrayDisposer *)*(undefined8 *)((long)local_148 + 0x38);
              }
              type._reader._36_4_ = local_228._36_4_;
              type._reader.dataSize = local_228._32_4_;
              type._reader.data._0_4_ = local_228._16_4_;
              type._reader.segment = (SegmentReader *)local_228._0_8_;
              type._reader.capTable = (CapTableReader *)local_228._8_8_;
              type._reader.data._4_4_ = local_228._20_4_;
              type._reader.pointers._0_4_ = local_228._24_4_;
              type._reader.pointers._4_4_ = local_228._28_4_;
              type._reader._40_8_ = local_228._40_8_;
              genType(&local_330,local_198,type,local_1a0,
                      (Maybe<capnp::InterfaceSchema::Method> *)local_2b8);
            }
            else if (sVar14 == 0) {
              local_228._8_8_ = 10;
              local_228._0_8_ = "AnyPointer";
              kj::StringTree::concat<kj::ArrayPtr<char_const>>
                        (&local_330,(StringTree *)local_228,params_00);
            }
            else {
              local_228._8_8_ = 0x11;
              local_228._0_8_ = "<unknown binding>";
              kj::StringTree::concat<kj::ArrayPtr<char_const>>
                        (&local_330,(StringTree *)local_228,params_00);
            }
            *(size_t *)&local_1f0->arena = local_330.size_;
            *(char **)&local_1f0->id = local_330.text.content.ptr;
            (local_1f0->ptr).ptr = (word *)local_330.text.content.size_;
            (local_1f0->ptr).size_ =
                 CONCAT44(local_330.text.content.disposer._4_4_,(int)local_330.text.content.disposer
                         );
            local_330.text.content.ptr = (char *)0x0;
            pcVar12 = local_330.text.content.ptr;
            local_330.text.content.size_ = 0;
            sVar22 = local_330.text.content.size_;
            local_1f0->readLimiter = (ReadLimiter *)local_330.branches.ptr;
            *(size_t *)&local_1f0[1].arena = local_330.branches.size_;
            *(ulong *)&local_1f0[1].id =
                 CONCAT44(local_330.branches.disposer._4_4_,local_330.branches.disposer._0_4_);
            local_330.branches.ptr = (Branch *)0x0;
            pBVar11 = local_330.branches.ptr;
            local_330.branches.size_ = 0;
            sVar13 = local_330.branches.size_;
            local_1f0 = (SegmentReader *)&local_1f0[1].ptr;
            local_330.branches.size_ = 0;
            local_330.branches.ptr = (Branch *)0x0;
            local_330.text.content.size_ = 0;
            local_330.text.content.ptr = (char *)0x0;
            _Var25 = (ElementCount)pSVar26 + _S_black;
            pSVar26 = (StringTree *)(ulong)_Var25;
          } while (_Var25 != p_Var20[2]._M_color);
        }
        local_268.capTable =
             (CapTableReader *)(((long)local_1f0 - local_228._48_8_ >> 3) * 0x6db6db6db6db6db7);
        local_268.segment = (SegmentReader *)local_228._48_8_;
        local_268.pointer = local_1e0;
        delim.content.size_ = 3;
        delim.content.ptr = ", ";
        kj::StringTree::StringTree(&local_330,(Array<kj::StringTree> *)&local_268,delim);
        params_2 = (SegmentReader *)0x1a39c7;
        kj::strTree<kj::StringTree,char_const(&)[2],kj::StringTree,char_const(&)[2]>
                  ((StringTree *)local_2b8,(kj *)local_368,(StringTree *)0x1978ac,
                   (char (*) [2])&local_330,(StringTree *)0x1a39c7,(char (*) [2])in_R9);
        pSVar23 = (SegmentReader *)local_368._16_8_;
        uVar9 = local_368._8_8_;
        local_368._0_8_ = local_2b8._0_8_;
        if ((StringTree *)local_368._8_8_ != (StringTree *)0x0) {
          local_368._8_8_ = (CapTableReader *)0x0;
          local_368._16_8_ = (byte *)0x0;
          in_R9 = (code *)0x0;
          (*(code *)**(undefined8 **)&uStack_350->arena)(uStack_350,uVar9,1);
          params_2 = pSVar23;
        }
        pSVar23 = pSStack_340;
        pBVar11 = local_348;
        local_368._8_8_ = local_2b8._8_8_;
        local_368._16_8_ = local_2b8._16_8_;
        uStack_350 = (SegmentReader *)local_2b8._24_8_;
        local_2b8._8_8_ = (Schema)0x0;
        local_2b8._16_8_ = (SegmentReader *)0x0;
        if (local_348 != (Branch *)0x0) {
          local_348 = (Branch *)0x0;
          pSStack_340 = (SegmentReader *)0x0;
          in_R9 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
          (*(code *)**(undefined8 **)local_338)(local_338,pBVar11,0x40);
          params_2 = pSVar23;
        }
        pSVar23 = (SegmentReader *)local_2b8._16_8_;
        uVar9 = local_2b8._8_8_;
        local_348 = (Branch *)local_298.value.file;
        pSStack_340 = (SegmentReader *)local_298._8_8_;
        local_338 = (ArrayDisposer *)local_298.value.description.content.ptr;
        local_298.value.file = (char *)0x0;
        local_298._8_8_ = (WirePointer *)0x0;
        if ((RawBrandedSchema *)local_2b8._8_8_ != (RawBrandedSchema *)0x0) {
          local_2b8._8_8_ = (Schema)0x0;
          local_2b8._16_8_ = (SegmentReader *)0x0;
          in_R9 = (code *)0x0;
          (*(code *)**(undefined8 **)(WireValue<uint32_t> *)local_2b8._24_8_)
                    (local_2b8._24_8_,uVar9,1);
          params_2 = pSVar23;
        }
        pSVar23 = (SegmentReader *)local_330.branches.size_;
        pBVar11 = local_330.branches.ptr;
        if (local_330.branches.ptr != (Branch *)0x0) {
          local_330.branches.ptr = (Branch *)0x0;
          local_330.branches.size_ = 0;
          in_R9 = kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct;
          (*(code *)**(undefined8 **)
                      CONCAT44(local_330.branches.disposer._4_4_,local_330.branches.disposer._0_4_))
                    ((undefined8 *)
                     CONCAT44(local_330.branches.disposer._4_4_,local_330.branches.disposer._0_4_),
                     pBVar11,0x40);
          params_2 = pSVar23;
        }
        pSVar23 = (SegmentReader *)local_330.text.content.size_;
        pcVar12 = local_330.text.content.ptr;
        if ((StringTree *)local_330.text.content.ptr != (StringTree *)0x0) {
          local_330.text.content.ptr = (char *)0x0;
          local_330.text.content.size_ = 0;
          in_R9 = (code *)0x0;
          (*(code *)**(undefined8 **)
                      CONCAT44(local_330.text.content.disposer._4_4_,
                               (int)local_330.text.content.disposer))
                    ((undefined8 *)
                     CONCAT44(local_330.text.content.disposer._4_4_,
                              (int)local_330.text.content.disposer),pcVar12,1);
          params_2 = pSVar23;
        }
        pSVar24 = (SegmentReader *)local_268.capTable;
        pSVar23 = local_268.segment;
        if (local_268.segment != (SegmentReader *)0x0) {
          local_268.segment = (SegmentReader *)0x0;
          local_268.capTable = (CapTableReader *)0x0;
          in_R9 = kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct;
          (**(code **)*local_268.pointer)(local_268.pointer,pSVar23,0x38);
          params_2 = pSVar24;
        }
      }
      pSStack_240->size_ = local_368._0_8_;
      (pSStack_240->text).content.ptr = (char *)local_368._8_8_;
      (pSStack_240->text).content.size_ = local_368._16_8_;
      (pSStack_240->text).content.disposer = (ArrayDisposer *)uStack_350;
      local_368._8_8_ = (CapTableReader *)0x0;
      uVar9 = local_368._8_8_;
      local_368._16_8_ = (byte *)0x0;
      uVar10 = local_368._16_8_;
      (pSStack_240->branches).ptr = local_348;
      (pSStack_240->branches).size_ = (size_t)pSStack_340;
      (pSStack_240->branches).disposer = local_338;
      local_348 = (Branch *)0x0;
      pBVar11 = local_348;
      pSStack_340 = (SegmentReader *)0x0;
      pSVar23 = pSStack_340;
      local_2f8.builder.pos = local_2f8.builder.pos + -1;
      pSStack_240 = pSStack_240 + 1;
      pSStack_340 = (SegmentReader *)0x0;
      local_348 = (Branch *)0x0;
      local_368._16_8_ = (byte *)0x0;
      local_368._8_8_ = (CapTableReader *)0x0;
    } while (local_2f8.builder.pos != local_2f8.builder.ptr);
  }
  local_2b8._8_8_ = ((long)pSStack_240 - (long)local_248 >> 3) * 0x6db6db6db6db6db7;
  local_2b8._0_8_ = local_248;
  local_2b8._16_8_ = local_230;
  local_248 = (StringTree *)0x0;
  pSStack_240 = (StringTree *)0x0;
  local_238 = (StringTree *)0x0;
  delim_00.content.size_ = 2;
  delim_00.content.ptr = ".";
  kj::StringTree::StringTree(local_1b0,(Array<kj::StringTree> *)local_2b8,delim_00);
  uVar10 = local_2b8._8_8_;
  uVar9 = local_2b8._0_8_;
  if ((StringTree *)local_2b8._0_8_ != (StringTree *)0x0) {
    local_2b8._0_8_ = (StringTree *)0x0;
    local_2b8._8_8_ = (Schema)0x0;
    (*(code *)**(undefined8 **)local_2b8._16_8_)
              (local_2b8._16_8_,uVar9,0x38,uVar10,uVar10,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  pSVar8 = local_238;
  pSVar7 = pSStack_240;
  pSVar26 = local_248;
  if (local_248 != (StringTree *)0x0) {
    local_248 = (StringTree *)0x0;
    pSStack_240 = (StringTree *)0x0;
    local_238 = (StringTree *)0x0;
    (*(code *)**(undefined8 **)local_230)
              (local_230,pSVar26,0x38,((long)pSVar7 - (long)pSVar26 >> 3) * 0x6db6db6db6db6db7,
               ((long)pSVar8 - (long)pSVar26 >> 3) * 0x6db6db6db6db6db7,
               kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>,_std::_Select1st<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::List<capnp::schema::Brand::Binding,_(capnp::Kind)3>::Reader>_>_>
  ::~_Rb_tree(&local_140);
  pSVar5 = local_2d8.builder.endPtr;
  pRVar4 = local_2d8.builder.pos;
  pSVar3 = local_2d8.builder.ptr;
  if (local_2d8.builder.ptr != (Schema *)0x0) {
    local_2d8.builder.ptr = (Schema *)0x0;
    local_2d8.builder.pos = (Schema *)0x0;
    local_2d8.builder.endPtr = (Schema *)0x0;
    (*(code *)**(undefined8 **)local_2d8.builder.disposer)
              (local_2d8.builder.disposer,pSVar3,8,(long)pRVar4 - (long)pSVar3 >> 3,
               (long)pSVar5 - (long)pSVar3 >> 3,0);
  }
  pSVar5 = local_2f8.builder.endPtr;
  pRVar4 = local_2f8.builder.pos;
  pSVar3 = local_2f8.builder.ptr;
  if (local_2f8.builder.ptr != (Schema *)0x0) {
    local_2f8.builder.ptr = (Schema *)0x0;
    local_2f8.builder.pos = (RemoveConst<capnp::Schema> *)0x0;
    local_2f8.builder.endPtr = (Schema *)0x0;
    (*(code *)**(undefined8 **)local_2f8.builder.disposer)
              (local_2f8.builder.disposer,pSVar3,8,(long)pRVar4 - (long)pSVar3 >> 3,
               (long)pSVar5 - (long)pSVar3 >> 3,0);
  }
  return local_1b0;
}

Assistant:

kj::StringTree nodeName(Schema target, Schema scope, schema::Brand::Reader brand,
                          kj::Maybe<InterfaceSchema::Method> method) {
    kj::Vector<Schema> targetPath;
    kj::Vector<Schema> scopeParts;

    targetPath.add(target);

    std::map<uint64_t, List<schema::Brand::Binding>::Reader> scopeBindings;
    for (auto scopeBrand: brand.getScopes()) {
      switch (scopeBrand.which()) {
        case schema::Brand::Scope::BIND:
          scopeBindings[scopeBrand.getScopeId()] = scopeBrand.getBind();
          break;
        case schema::Brand::Scope::INHERIT:
          // TODO(someday): We need to pay attention to INHERIT and be sure to explicitly override
          //   any bindings that are not inherited. This requires a way to determine which of our
          //   parent scopes have a non-empty parameter list.
          break;
      }
    }

    {
      Schema parent = target;
      while (parent.getProto().getScopeId() != 0) {
        parent = schemaLoader.get(parent.getProto().getScopeId());
        targetPath.add(parent);
      }
    }

    {
      Schema parent = scope;
      scopeParts.add(parent);
      while (parent.getProto().getScopeId() != 0) {
        parent = schemaLoader.get(parent.getProto().getScopeId());
        scopeParts.add(parent);
      }
    }

    // Remove common scope (unless it has been reparameterized).
    // TODO(someday):  This is broken in that we aren't checking for shadowing.
    while (!scopeParts.empty() && targetPath.size() > 1 &&
           scopeParts.back() == targetPath.back() &&
           scopeBindings.count(scopeParts.back().getProto().getId()) == 0) {
      scopeParts.removeLast();
      targetPath.removeLast();
    }

    auto parts = kj::heapArrayBuilder<kj::StringTree>(targetPath.size());
    while (!targetPath.empty()) {
      auto part = targetPath.back();
      auto proto = part.getProto();
      kj::StringTree partStr;
      if (proto.getScopeId() == 0) {
        partStr = kj::strTree("import \"/", proto.getDisplayName(), '\"');
      } else {
        partStr = kj::strTree(getUnqualifiedName(part));
      }

      auto iter = scopeBindings.find(proto.getId());
      if (iter != scopeBindings.end()) {
        auto bindings = KJ_MAP(binding, iter->second) {
          switch (binding.which()) {
            case schema::Brand::Binding::UNBOUND:
              return kj::strTree("AnyPointer");
            case schema::Brand::Binding::TYPE:
              return genType(binding.getType(), scope, method);
          }
          return kj::strTree("<unknown binding>");
        };
        partStr = kj::strTree(kj::mv(partStr), "(", kj::StringTree(kj::mv(bindings), ", "), ")");
      }

      parts.add(kj::mv(partStr));
      targetPath.removeLast();
    }

    return kj::StringTree(parts.finish(), ".");
  }